

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
            );
  internal::InitProtobufDefaults();
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&_FileDescriptorSet_default_instance_);
  DAT_0042ef20 = 1;
  FileDescriptorProto::FileDescriptorProto
            ((FileDescriptorProto *)&_FileDescriptorProto_default_instance_);
  DAT_0042f000 = 1;
  DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
            ((DescriptorProto_ExtensionRange *)&_DescriptorProto_ExtensionRange_default_instance_);
  DAT_0042f028 = 1;
  DescriptorProto_ReservedRange::DescriptorProto_ReservedRange
            ((DescriptorProto_ReservedRange *)&_DescriptorProto_ReservedRange_default_instance_);
  DAT_0042f050 = 1;
  DescriptorProto::DescriptorProto((DescriptorProto *)&_DescriptorProto_default_instance_);
  DAT_0042f140 = 1;
  FieldDescriptorProto::FieldDescriptorProto
            ((FieldDescriptorProto *)&_FieldDescriptorProto_default_instance_);
  DAT_0042f1a0 = 1;
  OneofDescriptorProto::OneofDescriptorProto
            ((OneofDescriptorProto *)&_OneofDescriptorProto_default_instance_);
  DAT_0042f1d0 = 1;
  EnumDescriptorProto::EnumDescriptorProto
            ((EnumDescriptorProto *)&_EnumDescriptorProto_default_instance_);
  DAT_0042f218 = 1;
  EnumValueDescriptorProto::EnumValueDescriptorProto
            ((EnumValueDescriptorProto *)&_EnumValueDescriptorProto_default_instance_);
  DAT_0042f250 = 1;
  ServiceDescriptorProto::ServiceDescriptorProto
            ((ServiceDescriptorProto *)&_ServiceDescriptorProto_default_instance_);
  DAT_0042f298 = 1;
  MethodDescriptorProto::MethodDescriptorProto
            ((MethodDescriptorProto *)&_MethodDescriptorProto_default_instance_);
  DAT_0042f2e0 = 1;
  FileOptions::FileOptions((FileOptions *)&_FileOptions_default_instance_);
  DAT_0042f398 = 1;
  MessageOptions::MessageOptions((MessageOptions *)&_MessageOptions_default_instance_);
  DAT_0042f410 = 1;
  FieldOptions::FieldOptions((FieldOptions *)&_FieldOptions_default_instance_);
  DAT_0042f490 = 1;
  OneofOptions::OneofOptions((OneofOptions *)&_OneofOptions_default_instance_);
  DAT_0042f500 = 1;
  EnumOptions::EnumOptions((EnumOptions *)&_EnumOptions_default_instance_);
  DAT_0042f578 = 1;
  EnumValueOptions::EnumValueOptions((EnumValueOptions *)&_EnumValueOptions_default_instance_);
  DAT_0042f5f0 = 1;
  ServiceOptions::ServiceOptions((ServiceOptions *)&_ServiceOptions_default_instance_);
  DAT_0042f668 = 1;
  MethodOptions::MethodOptions((MethodOptions *)&_MethodOptions_default_instance_);
  DAT_0042f6e0 = 1;
  UninterpretedOption_NamePart::UninterpretedOption_NamePart
            ((UninterpretedOption_NamePart *)&_UninterpretedOption_NamePart_default_instance_);
  DAT_0042f710 = 1;
  UninterpretedOption::UninterpretedOption
            ((UninterpretedOption *)&_UninterpretedOption_default_instance_);
  DAT_0042f778 = 1;
  SourceCodeInfo_Location::SourceCodeInfo_Location
            ((SourceCodeInfo_Location *)&_SourceCodeInfo_Location_default_instance_);
  DAT_0042f7f0 = 1;
  SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&_SourceCodeInfo_default_instance_);
  DAT_0042f828 = 1;
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)&_GeneratedCodeInfo_Annotation_default_instance_);
  DAT_0042f870 = 1;
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&_GeneratedCodeInfo_default_instance_);
  DAT_0042eff0 = &_FileOptions_default_instance_;
  DAT_0042eff8 = &_SourceCodeInfo_default_instance_;
  DAT_0042f138 = &_MessageOptions_default_instance_;
  DAT_0042f188 = &_FieldOptions_default_instance_;
  DAT_0042f1c8 = &_OneofOptions_default_instance_;
  DAT_0042f210 = &_EnumOptions_default_instance_;
  DAT_0042f240 = &_EnumValueOptions_default_instance_;
  DAT_0042f290 = &_ServiceOptions_default_instance_;
  DAT_0042f2d0 = &_MethodOptions_default_instance_;
  DAT_0042f8a8 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _FileDescriptorSet_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.DefaultConstruct();
  _DescriptorProto_ExtensionRange_default_instance_.DefaultConstruct();
  _DescriptorProto_ReservedRange_default_instance_.DefaultConstruct();
  _DescriptorProto_default_instance_.DefaultConstruct();
  _FieldDescriptorProto_default_instance_.DefaultConstruct();
  _OneofDescriptorProto_default_instance_.DefaultConstruct();
  _EnumDescriptorProto_default_instance_.DefaultConstruct();
  _EnumValueDescriptorProto_default_instance_.DefaultConstruct();
  _ServiceDescriptorProto_default_instance_.DefaultConstruct();
  _MethodDescriptorProto_default_instance_.DefaultConstruct();
  _FileOptions_default_instance_.DefaultConstruct();
  _MessageOptions_default_instance_.DefaultConstruct();
  _FieldOptions_default_instance_.DefaultConstruct();
  _OneofOptions_default_instance_.DefaultConstruct();
  _EnumOptions_default_instance_.DefaultConstruct();
  _EnumValueOptions_default_instance_.DefaultConstruct();
  _ServiceOptions_default_instance_.DefaultConstruct();
  _MethodOptions_default_instance_.DefaultConstruct();
  _UninterpretedOption_NamePart_default_instance_.DefaultConstruct();
  _UninterpretedOption_default_instance_.DefaultConstruct();
  _SourceCodeInfo_Location_default_instance_.DefaultConstruct();
  _SourceCodeInfo_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_Annotation_default_instance_.DefaultConstruct();
  _GeneratedCodeInfo_default_instance_.DefaultConstruct();
  _FileDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FileOptions*>(
      ::google::protobuf::FileOptions::internal_default_instance());
  _FileDescriptorProto_default_instance_.get_mutable()->source_code_info_ = const_cast< ::google::protobuf::SourceCodeInfo*>(
      ::google::protobuf::SourceCodeInfo::internal_default_instance());
  _DescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MessageOptions*>(
      ::google::protobuf::MessageOptions::internal_default_instance());
  _FieldDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::FieldOptions*>(
      ::google::protobuf::FieldOptions::internal_default_instance());
  _OneofDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::OneofOptions*>(
      ::google::protobuf::OneofOptions::internal_default_instance());
  _EnumDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumOptions*>(
      ::google::protobuf::EnumOptions::internal_default_instance());
  _EnumValueDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::EnumValueOptions*>(
      ::google::protobuf::EnumValueOptions::internal_default_instance());
  _ServiceDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::ServiceOptions*>(
      ::google::protobuf::ServiceOptions::internal_default_instance());
  _MethodDescriptorProto_default_instance_.get_mutable()->options_ = const_cast< ::google::protobuf::MethodOptions*>(
      ::google::protobuf::MethodOptions::internal_default_instance());
}